

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention.cc
# Opt level: O2

FileOptions *
google::protobuf::compiler::StripLocalSourceRetentionOptions
          (FileOptions *__return_storage_ptr__,FileDescriptor *descriptor)

{
  FileOptions options;
  FileOptions FStack_c8;
  
  FileOptions::FileOptions(&FStack_c8,descriptor->options_);
  anon_unknown_0::ConvertToDynamicMessageAndStripOptions
            (&FStack_c8.super_Message,descriptor->pool_,
             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)0x0);
  FileOptions::FileOptions(__return_storage_ptr__,&FStack_c8);
  FileOptions::~FileOptions(&FStack_c8);
  return __return_storage_ptr__;
}

Assistant:

FileOptions StripLocalSourceRetentionOptions(const FileDescriptor& descriptor) {
  return StripLocalOptions(descriptor);
}